

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Draw.hpp
# Opt level: O0

void __thiscall
TI::TMS::Base<(TI::TMS::Personality)0>::draw_tms_character<(TI::TMS::SpriteMode)0>
          (Base<(TI::TMS::Personality)0> *this,int start,int end)

{
  int start_00;
  int iVar1;
  byte bVar2;
  array<unsigned_int,_16UL> *paVar3;
  const_reference pvVar4;
  int *piVar5;
  uint local_a4;
  uint local_94;
  uint local_84;
  uint local_6c;
  int local_54;
  int local_50;
  int local_4c;
  int c_1;
  int background_pixels_left;
  uint32_t colours [2];
  int iStack_38;
  uint8_t colour;
  int pattern;
  int local_30;
  int length;
  int byte_column;
  int shift;
  int c;
  int pixels_left;
  value_type *line_buffer;
  int end_local;
  int start_local;
  Base<(TI::TMS::Personality)0> *this_local;
  
  _c = this->draw_line_buffer_;
  shift = end - start;
  iVar1 = start;
  line_buffer._0_4_ = end;
  line_buffer._4_4_ = start;
  _end_local = this;
  if (this->screen_mode_ == MultiColour) {
    while (byte_column = iVar1, byte_column < (int)line_buffer) {
      paVar3 = palette(this);
      pvVar4 = std::array<unsigned_int,_16UL>::operator[]
                         (paVar3,(long)(int)((int)(uint)(_c->field_5).bitmap
                                                        [(long)(byte_column >> 3) * 4 + 0x20] >>
                                             ((byte)byte_column & 4 ^ 4) & 0xf));
      this->pixel_target_[byte_column] = *pvVar4;
      iVar1 = byte_column + 1;
    }
  }
  else {
    length = start & 7;
    local_30 = start >> 3;
    iStack_38 = 8 - length;
    piVar5 = std::min<int>(&shift,&stack0xffffffffffffffc8);
    pattern = *piVar5;
    bVar2 = Numeric::bit_reverse<unsigned_char>((_c->field_5).bitmap[(long)local_30 * 4 + 0x20]);
    colours[1] = (int)(uint)bVar2 >> ((byte)length & 0x1f);
    colours[0]._3_1_ = (_c->field_5).bitmap[(long)local_30 * 4 + 0x21];
    paVar3 = palette(this);
    if ((colours[0]._3_1_ & 0xf) == 0) {
      local_6c = (uint)this->background_colour_;
    }
    else {
      local_6c = colours[0]._3_1_ & 0xf;
    }
    pvVar4 = std::array<unsigned_int,_16UL>::operator[](paVar3,(long)(int)local_6c);
    c_1 = *pvVar4;
    paVar3 = palette(this);
    if ((int)(uint)colours[0]._3_1_ >> 4 == 0) {
      local_84 = (uint)this->background_colour_;
    }
    else {
      local_84 = (int)(uint)colours[0]._3_1_ >> 4;
    }
    pvVar4 = std::array<unsigned_int,_16UL>::operator[](paVar3,(long)(int)local_84);
    background_pixels_left = *pvVar4;
    local_4c = shift;
    while( true ) {
      local_4c = local_4c - pattern;
      for (local_50 = 0; local_50 < pattern; local_50 = local_50 + 1) {
        this->pixel_target_[local_50] = (&c_1)[(int)(colours[1] & 1)];
        colours[1] = (int)colours[1] >> 1;
      }
      this->pixel_target_ = this->pixel_target_ + pattern;
      if (local_4c == 0) break;
      local_54 = 8;
      piVar5 = std::min<int>(&local_54,&local_4c);
      pattern = *piVar5;
      local_30 = local_30 + 1;
      bVar2 = Numeric::bit_reverse<unsigned_char>((_c->field_5).bitmap[(long)local_30 * 4 + 0x20]);
      colours[1] = (uint32_t)bVar2;
      colours[0]._3_1_ = (_c->field_5).bitmap[(long)local_30 * 4 + 0x21];
      paVar3 = palette(this);
      if ((colours[0]._3_1_ & 0xf) == 0) {
        local_94 = (uint)this->background_colour_;
      }
      else {
        local_94 = colours[0]._3_1_ & 0xf;
      }
      pvVar4 = std::array<unsigned_int,_16UL>::operator[](paVar3,(long)(int)local_94);
      c_1 = *pvVar4;
      paVar3 = palette(this);
      if ((int)(uint)colours[0]._3_1_ >> 4 == 0) {
        local_a4 = (uint)this->background_colour_;
      }
      else {
        local_a4 = (int)(uint)colours[0]._3_1_ >> 4;
      }
      pvVar4 = std::array<unsigned_int,_16UL>::operator[](paVar3,(long)(int)local_a4);
      background_pixels_left = *pvVar4;
    }
    local_4c = 0;
  }
  start_00 = line_buffer._4_4_;
  iVar1 = (int)line_buffer;
  paVar3 = palette(this);
  draw_sprites<(TI::TMS::SpriteMode)0,false>(this,'\0',start_00,iVar1,paVar3,(int *)0x0);
  return;
}

Assistant:

void Base<personality>::draw_tms_character(int start, int end) {
	auto &line_buffer = *draw_line_buffer_;

	// Paint the background tiles.
	const int pixels_left = end - start;
	if(this->screen_mode_ == ScreenMode::MultiColour) {
		for(int c = start; c < end; ++c) {
			pixel_target_[c] = palette()[
				(line_buffer.tiles.patterns[c >> 3][0] >> (((c & 4)^4))) & 15
			];
		}
	} else {
		const int shift = start & 7;
		int byte_column = start >> 3;

		int length = std::min(pixels_left, 8 - shift);

		int pattern = Numeric::bit_reverse(line_buffer.tiles.patterns[byte_column][0]) >> shift;
		uint8_t colour = line_buffer.tiles.patterns[byte_column][1];
		uint32_t colours[2] = {
			palette()[(colour & 15) ? (colour & 15) : background_colour_],
			palette()[(colour >> 4) ? (colour >> 4) : background_colour_]
		};

		int background_pixels_left = pixels_left;
		while(true) {
			background_pixels_left -= length;
			for(int c = 0; c < length; ++c) {
				pixel_target_[c] = colours[pattern&0x01];
				pattern >>= 1;
			}
			pixel_target_ += length;

			if(!background_pixels_left) break;
			length = std::min(8, background_pixels_left);
			byte_column++;

			pattern = Numeric::bit_reverse(line_buffer.tiles.patterns[byte_column][0]);
			colour = line_buffer.tiles.patterns[byte_column][1];
			colours[0] = palette()[(colour & 15) ? (colour & 15) : background_colour_];
			colours[1] = palette()[(colour >> 4) ? (colour >> 4) : background_colour_];
		}
	}

	draw_sprites<sprite_mode, false>(0, start, end, palette());	// TODO: propagate a real 'y' into here.
}